

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

Matrix4x4 * __thiscall CMU462::Application::get_world_to_3DH(Application *this)

{
  double *pdVar1;
  Matrix4x4 *in_RSI;
  Matrix4x4 *in_RDI;
  SceneObject *sel;
  Matrix4x4 M;
  Matrix4x4 V;
  Matrix4x4 P;
  int in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  Matrix4x4 *this_00;
  Matrix4x4 *in_stack_fffffffffffffc00;
  Matrix4x4 *in_stack_fffffffffffffc08;
  undefined1 local_398 [128];
  undefined1 local_318 [128];
  undefined1 local_298 [32];
  Camera *in_stack_fffffffffffffd88;
  undefined1 local_218 [128];
  long *local_198;
  undefined1 local_190 [128];
  undefined1 local_110 [272];
  
  this_00 = in_RDI;
  Matrix4x4::Matrix4x4(in_RSI);
  Matrix4x4::Matrix4x4(in_RSI);
  Matrix4x4::Matrix4x4(in_RSI);
  pdVar1 = Matrix4x4::operator()(this_00,in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8);
  glGetDoublev(0xba7,pdVar1);
  local_198 = *(long **)((long)in_RSI->entries[2].z + 0x30);
  if (local_198 == (long *)0x0) {
    Matrix4x4::identity();
    memcpy(local_190,local_318,0x80);
  }
  else if (local_198 == *(long **)((long)in_RSI->entries[2].z + 0x90)) {
    (**(code **)(**(long **)(*(long *)((long)in_RSI->entries[2].z + 0x90) + 0xf0) + 0x58))
              (local_218);
    memcpy(local_190,local_218,0x80);
  }
  else {
    (**(code **)(*local_198 + 0x58))(local_298);
    memcpy(local_190,local_298,0x80);
  }
  Camera::getTransformation(in_stack_fffffffffffffd88);
  memcpy(local_110,local_398,0x80);
  Matrix4x4::operator*(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  Matrix4x4::operator*(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  return in_RDI;
}

Assistant:

Matrix4x4 Application::get_world_to_3DH() {
  Matrix4x4 P, V, M;
  glGetDoublev(GL_PROJECTION_MATRIX, &P(0, 0));
  auto sel = scene->selected.object;
  if(sel) {
    if(sel == scene->elementTransform)
      M = scene->elementTransform->target.object->getTransformation();
    else
      M = sel->getTransformation();
  }
  else
    M = Matrix4x4::identity();
  V = camera.getTransformation();
  return P * V * M;
}